

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O1

void inc_counter(uchar *counter,size_t counter_bytes)

{
  uchar uVar1;
  uint n;
  uint uVar2;
  
  uVar2 = (uint)counter_bytes;
  do {
    uVar2 = uVar2 - 1;
    uVar1 = counter[uVar2];
    counter[uVar2] = uVar1 + '\x01';
    if (uVar2 == 0) {
      return;
    }
  } while ((uchar)(uVar1 + '\x01') == '\0');
  return;
}

Assistant:

void inc_counter(unsigned char *counter, size_t counter_bytes)
{
    unsigned int n = counter_bytes;

    do {
        unsigned char c;
        --n;
        c = counter[n];
        ++c;
        counter[n] = c;
        if (c)
            return;
    } while (n);
}